

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_uri.c
# Opt level: O1

ares_bool_t ares_uri_chis_fragment(char x)

{
  uint uVar1;
  ares_bool_t aVar2;
  ares_bool_t aVar3;
  undefined7 in_register_00000039;
  
  aVar3 = ARES_TRUE;
  uVar1 = (int)CONCAT71(in_register_00000039,x) - 0x2f;
  if ((0x11 < uVar1) || ((0x30801U >> (uVar1 & 0x1f) & 1) == 0)) {
    aVar2 = ares_uri_chis_unreserved(x);
    if ((aVar2 == ARES_FALSE) &&
       ((0x3d < (uint)(int)x || ((0x28001fd200000000U >> ((ulong)(uint)(int)x & 0x3f) & 1) == 0))))
    {
      aVar3 = ARES_FALSE;
    }
  }
  return aVar3;
}

Assistant:

static ares_bool_t ares_uri_chis_fragment(char x)
{
  switch (x) {
    case '/':
      return ARES_TRUE;
    case '?':
      return ARES_TRUE;
    default:
      break;
  }
  return ares_uri_chis_path(x);
}